

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Serializer.hpp
# Opt level: O3

void __thiscall
Diligent::Serializer<(Diligent::SerializerMode)0>::AlignOffset
          (Serializer<(Diligent::SerializerMode)0> *this,size_t Alignment)

{
  size_t sVar1;
  TPointer puVar2;
  char (*in_R8) [23];
  long lVar3;
  string msg;
  size_t local_40;
  string local_38;
  
  sVar1 = GetSize(this);
  local_40 = Alignment;
  if ((Alignment ^ Alignment - 1) <= Alignment - 1) {
    FormatString<char[12],unsigned_long,char[23]>
              (&local_38,(Diligent *)"Alignment (",(char (*) [12])&local_40,
               (unsigned_long *)") must be a power of 2",in_R8);
    DebugAssertionFailed
              (local_38._M_dataplus._M_p,"AlignUp",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Common/interface/Align.hpp"
               ,0x34);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_38._M_dataplus._M_p != &local_38.field_2) {
      operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
    }
  }
  lVar3 = (-local_40 & (sVar1 + local_40) - 1) - sVar1;
  puVar2 = this->m_Ptr;
  if ((char (*) [28])this->m_End < (char (*) [28])(puVar2 + lVar3)) {
    FormatString<char[26],char[28]>
              (&local_38,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"m_Ptr + AlignShift <= m_End",(char (*) [28])(puVar2 + lVar3));
    DebugAssertionFailed
              (local_38._M_dataplus._M_p,"AlignOffset",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Common/interface/Serializer.hpp"
               ,0x12f);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_38._M_dataplus._M_p != &local_38.field_2) {
      operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
    }
    puVar2 = this->m_Ptr;
  }
  this->m_Ptr = puVar2 + lVar3;
  return;
}

Assistant:

void AlignOffset(size_t Alignment)
    {
        const auto Size       = GetSize();
        const auto AlignShift = AlignUp(Size, Alignment) - Size;
        VERIFY_EXPR(m_Ptr + AlignShift <= m_End);
        m_Ptr += AlignShift;
    }